

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall GLDrawList::DoDrawSorted(GLDrawList *this,SortNode *head)

{
  GLDrawItem *pGVar1;
  float fVar2;
  float fVar3;
  int i;
  SortNode *ehead;
  SortNode *pSVar4;
  int iVar5;
  float local_34;
  
  fVar3 = gl_RenderState.mClipSplit[1];
  fVar2 = gl_RenderState.mClipSplit[0];
  i = head->itemindex;
  pGVar1 = (this->drawitems).Array;
  if (pGVar1[i].rendertype == GLDIT_FLAT) {
    local_34 = (this->flats).Array[pGVar1[i].index].z;
    iVar5 = (uint)(ViewPos.Z < (double)local_34) * 2 + -1;
  }
  else {
    local_34 = 0.0;
    iVar5 = 0;
  }
  if (head->left != (SortNode *)0x0) {
    if (iVar5 == 1) {
      gl_RenderState.mClipSplit[0] = local_34;
    }
    else if (iVar5 == -1) {
      gl_RenderState.mClipSplit[1] = local_34;
    }
    DoDrawSorted(this,head->left);
    i = head->itemindex;
  }
  gl_RenderState.mClipSplit[0] = fVar2;
  gl_RenderState.mClipSplit[1] = fVar3;
  DoDraw(this,4,i,true);
  for (pSVar4 = head->equal; pSVar4 != (SortNode *)0x0; pSVar4 = pSVar4->equal) {
    DoDraw(this,4,pSVar4->itemindex,true);
  }
  if (head->right != (SortNode *)0x0) {
    if (iVar5 == -1) {
      gl_RenderState.mClipSplit[0] = local_34;
      gl_RenderState.mClipSplit[1] = fVar3;
    }
    else if (iVar5 == 1) {
      gl_RenderState.mClipSplit[1] = local_34;
      gl_RenderState.mClipSplit[0] = fVar2;
    }
    DoDrawSorted(this,head->right);
    gl_RenderState.mClipSplit[0] = fVar2;
    gl_RenderState.mClipSplit[1] = fVar3;
  }
  return;
}

Assistant:

void GLDrawList::DoDrawSorted(SortNode * head)
{
	float clipsplit[2];
	int relation = 0;
	float z = 0.f;

	gl_RenderState.GetClipSplit(clipsplit);

	if (drawitems[head->itemindex].rendertype == GLDIT_FLAT)
	{
		z = flats[drawitems[head->itemindex].index].z;
		relation = z > ViewPos.Z ? 1 : -1;
	}


	// left is further away, i.e. for stuff above viewz its z coordinate higher, for stuff below viewz its z coordinate is lower
	if (head->left) 
	{
		if (relation == -1)
		{
			gl_RenderState.SetClipSplit(clipsplit[0], z);	// render below: set flat as top clip plane
		}
		else if (relation == 1)
		{
			gl_RenderState.SetClipSplit(z, clipsplit[1]);	// render above: set flat as bottom clip plane
		}
		DoDrawSorted(head->left);
		gl_RenderState.SetClipSplit(clipsplit);
	}
	DoDraw(GLPASS_TRANSLUCENT, head->itemindex, true);
	if (head->equal)
	{
		SortNode * ehead=head->equal;
		while (ehead)
		{
			DoDraw(GLPASS_TRANSLUCENT, ehead->itemindex, true);
			ehead=ehead->equal;
		}
	}
	// right is closer, i.e. for stuff above viewz its z coordinate is lower, for stuff below viewz its z coordinate is higher
	if (head->right)
	{
		if (relation == 1)
		{
			gl_RenderState.SetClipSplit(clipsplit[0], z);	// render below: set flat as top clip plane
		}
		else if (relation == -1)
		{
			gl_RenderState.SetClipSplit(z, clipsplit[1]);	// render above: set flat as bottom clip plane
		}
		DoDrawSorted(head->right);
		gl_RenderState.SetClipSplit(clipsplit);
	}
}